

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall
cppcms::impl::tcp_cache_service::session::on_header_in(session *this,error_code *e,size_t param_3)

{
  bool bVar1;
  error_code *in_RSI;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  error_code *in_stack_000000a8;
  session *in_stack_000000b0;
  size_t in_stack_00000170;
  error_code *in_stack_00000178;
  session *in_stack_00000180;
  mutable_buffer *this_00;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_ffffffffffffff98;
  offset_in_session_to_subr in_stack_ffffffffffffffa0;
  callback local_48 [72];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    handle_error(in_stack_000000b0,in_stack_000000a8);
  }
  else {
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x484d54)
    ;
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (*(int *)((long)&in_RDI[0xe].call_ptr.p_ + 4) == 0) {
      on_data_in(in_stack_00000180,in_stack_00000178,in_stack_00000170);
    }
    else {
      this_00 = (mutable_buffer *)(in_RDI + 0x13);
      booster::aio::buffer(in_stack_ffffffffffffff78);
      std::enable_shared_from_this<cppcms::impl::tcp_cache_service::session>::shared_from_this
                ((enable_shared_from_this<cppcms::impl::tcp_cache_service::session> *)this_00);
      mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      booster::callback<void(std::error_code_const&,unsigned_long)>::
      callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
                (in_RDI,(intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                         *)this_00);
      booster::aio::stream_socket::async_read(this_00,local_48);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x484e0a);
      booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
      ~intrusive_ptr(&in_RDI->call_ptr);
      std::shared_ptr<cppcms::impl::tcp_cache_service::session>::~shared_ptr
                ((shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x484e1e);
      booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x484e28);
    }
  }
  return;
}

Assistant:

void on_header_in(booster::system::error_code const &e,size_t)
	{
		if(e) { handle_error(e); return; }
		data_in_.clear();
		data_in_.resize(hin_.size);
		if(hin_.size > 0) {
			socket_.async_read(io::buffer(data_in_),
				mfunc_to_io_handler(&session::on_data_in,shared_from_this()));
		}
		else {
			on_data_in(e,0);
		}
	}